

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResupplyReceivedPdu.cpp
# Opt level: O3

void __thiscall
DIS::ResupplyReceivedPdu::unmarshal(ResupplyReceivedPdu *this,DataStream *dataStream)

{
  uchar *c;
  pointer pSVar1;
  pointer pSVar2;
  pointer pSVar3;
  ulong uVar4;
  SupplyQuantity x;
  SupplyQuantity local_50;
  
  LogisticsFamilyPdu::unmarshal(&this->super_LogisticsFamilyPdu,dataStream);
  EntityID::unmarshal(&this->_receivingEntityID,dataStream);
  EntityID::unmarshal(&this->_supplyingEntityID,dataStream);
  c = &this->_numberOfSupplyTypes;
  DataStream::operator>>(dataStream,c);
  DataStream::operator>>(dataStream,&this->_padding1);
  DataStream::operator>>(dataStream,&this->_padding2);
  pSVar1 = (this->_supplies).
           super__Vector_base<DIS::SupplyQuantity,_std::allocator<DIS::SupplyQuantity>_>._M_impl.
           super__Vector_impl_data._M_start;
  pSVar2 = (this->_supplies).
           super__Vector_base<DIS::SupplyQuantity,_std::allocator<DIS::SupplyQuantity>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pSVar3 = pSVar1;
  if (pSVar2 != pSVar1) {
    do {
      (**pSVar3->_vptr_SupplyQuantity)(pSVar3);
      pSVar3 = pSVar3 + 1;
    } while (pSVar3 != pSVar2);
    (this->_supplies).super__Vector_base<DIS::SupplyQuantity,_std::allocator<DIS::SupplyQuantity>_>.
    _M_impl.super__Vector_impl_data._M_finish = pSVar1;
  }
  if (*c != '\0') {
    uVar4 = 0;
    do {
      SupplyQuantity::SupplyQuantity(&local_50);
      SupplyQuantity::unmarshal(&local_50,dataStream);
      std::vector<DIS::SupplyQuantity,_std::allocator<DIS::SupplyQuantity>_>::push_back
                (&this->_supplies,&local_50);
      SupplyQuantity::~SupplyQuantity(&local_50);
      uVar4 = uVar4 + 1;
    } while (uVar4 < *c);
  }
  return;
}

Assistant:

void ResupplyReceivedPdu::unmarshal(DataStream& dataStream)
{
    LogisticsFamilyPdu::unmarshal(dataStream); // unmarshal information in superclass first
    _receivingEntityID.unmarshal(dataStream);
    _supplyingEntityID.unmarshal(dataStream);
    dataStream >> _numberOfSupplyTypes;
    dataStream >> _padding1;
    dataStream >> _padding2;

     _supplies.clear();
     for(size_t idx = 0; idx < _numberOfSupplyTypes; idx++)
     {
        SupplyQuantity x;
        x.unmarshal(dataStream);
        _supplies.push_back(x);
     }
}